

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileStdio::Read(FileStdio *this,char *buffer,size_t size,size_t start)

{
  int __val;
  ulong uVar1;
  bool bVar2;
  anon_class_8_1_8991fb9c lf_Read;
  anon_class_8_1_8991fb9c local_118;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_118.this = this;
  WaitForOpen(this);
  if (start != 0xffffffffffffffff) {
    __val = fseek((FILE *)this->m_File,start,0);
    std::__cxx11::to_string(&local_50,start);
    std::operator+(&local_f0,"couldn\'t move to start position ",&local_50);
    std::operator+(&local_d0,&local_f0," in file ");
    std::operator+(&local_b0,&local_d0,&(this->super_Transport).m_Name);
    std::operator+(&local_90,&local_b0,", in call to stdio fseek for read, result=");
    std::__cxx11::to_string(&local_110,__val);
    std::operator+(&local_70,&local_90,&local_110);
    CheckFile(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (0x7ffe7000 < size) {
    uVar1 = size / 0x7ffe7000;
    size = size % 0x7ffe7000;
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      Read::anon_class_8_1_8991fb9c::operator()(&local_118,buffer,0x7ffe7000);
      buffer = buffer + 0x7ffe7000;
    }
  }
  Read::anon_class_8_1_8991fb9c::operator()(&local_118,buffer,size);
  return;
}

Assistant:

void FileStdio::Read(char *buffer, size_t size, size_t start)
{
    auto lf_Read = [&](char *buffer, size_t size) {
        ProfilerStart("read");
        const auto readSize = std::fread(buffer, sizeof(char), size, m_File);
        ProfilerStop("read");

        CheckFile("couldn't read to file " + m_Name + ", in call to stdio fread");

        if (readSize != size)
        {
            helper::Throw<std::ios_base::failure>(
                "Toolkit", "transport::file::FileStdio", "Read",
                "read size of " + std::to_string(readSize) + " is not equal to intended size " +
                    std::to_string(size) + " in file " + m_Name + ", in call to stdio fread");
        }
    };

    WaitForOpen();
    if (start != MaxSizeT)
    {
        const auto status = std::fseek(m_File, static_cast<long int>(start), SEEK_SET);
        CheckFile("couldn't move to start position " + std::to_string(start) + " in file " +
                  m_Name + ", in call to stdio fseek for read, result=" + std::to_string(status));
    }

    if (size > DefaultMaxFileBatchSize)
    {
        const size_t batches = size / DefaultMaxFileBatchSize;
        const size_t remainder = size % DefaultMaxFileBatchSize;

        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            lf_Read(&buffer[position], DefaultMaxFileBatchSize);
            position += DefaultMaxFileBatchSize;
        }
        lf_Read(&buffer[position], remainder);
    }
    else
    {
        lf_Read(buffer, size);
    }
}